

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void __thiscall
cmCacheManager::CacheEntry::AppendProperty(CacheEntry *this,string *prop,char *value,bool asString)

{
  int iVar1;
  CacheEntryType CVar2;
  char *s;
  
  iVar1 = std::__cxx11::string::compare((char *)prop);
  if (iVar1 == 0) {
    s = "STRING";
    if (value != (char *)0x0) {
      s = value;
    }
    CVar2 = cmState::StringToCacheEntryType(s);
    this->Type = CVar2;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)prop);
    if (iVar1 != 0) {
      cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
      return;
    }
    if (value != (char *)0x0) {
      if (((this->Value)._M_string_length != 0) && (*value != '\0' && !asString)) {
        std::__cxx11::string::append((char *)this);
      }
      std::__cxx11::string::append((char *)this);
      return;
    }
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::AppendProperty(const std::string& prop,
                                                const char* value,
                                                bool asString)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType(value ? value : "STRING");
  } else if (prop == "VALUE") {
    if (value) {
      if (!this->Value.empty() && *value && !asString) {
        this->Value += ";";
      }
      this->Value += value;
    }
  } else {
    this->Properties.AppendProperty(prop, value, asString);
  }
}